

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwizard.cpp
# Opt level: O0

void QWizardPage::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QWizardPage *_t;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int iVar3;
  int in_stack_ffffffffffffff84;
  QWizardPage *in_stack_ffffffffffffff88;
  QWizardPagePrivate *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff84 = in_EDX;
    if (in_EDX == 0) {
      completeChanged((QWizardPage *)0x7bdfad);
    }
    else if (in_EDX == 1) {
      d_func((QWizardPage *)0x7bdfb9);
      QWizardPagePrivate::_q_maybeEmitCompleteChanged(in_stack_ffffffffffffff90);
    }
    else if (in_EDX == 2) {
      d_func((QWizardPage *)0x7bdfcd);
      QWizardPagePrivate::_q_updateCachedCompleteState
                ((QWizardPagePrivate *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                );
    }
  }
  if ((in_ESI != 5) ||
     (bVar2 = QtMocHelpers::indexOfMethod<void(QWizardPage::*)()>
                        (in_RCX,(void **)completeChanged,0,0), !bVar2)) {
    if (in_ESI == 1) {
      in_stack_ffffffffffffff90 = *(QWizardPagePrivate **)in_RCX;
      if (in_EDX == 0) {
        iVar3 = in_EDX;
        title(in_stack_ffffffffffffff88);
        QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff84,iVar3),
                           (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
        ;
        QString::~QString((QString *)0x7be06f);
      }
      else if (in_EDX == 1) {
        iVar3 = in_EDX;
        subTitle(in_stack_ffffffffffffff88);
        QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff84,iVar3),
                           (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
        ;
        QString::~QString((QString *)0x7be099);
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == 0) {
        setTitle((QWizardPage *)in_stack_ffffffffffffff90,*(QString **)in_RCX);
      }
      else if (in_EDX == 1) {
        setSubTitle((QWizardPage *)in_stack_ffffffffffffff90,*(QString **)in_RCX);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPage::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWizardPage *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->completeChanged(); break;
        case 1: _t->d_func()->_q_maybeEmitCompleteChanged(); break;
        case 2: _t->d_func()->_q_updateCachedCompleteState(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWizardPage::*)()>(_a, &QWizardPage::completeChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->subTitle(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setSubTitle(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}